

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_complex_div(sexp ctx,sexp a,sexp b)

{
  sexp psVar1;
  sexp imag;
  sexp res;
  sexp denom;
  sexp real;
  sexp local_90;
  sexp local_88;
  sexp local_80;
  sexp local_78;
  sexp *local_70;
  sexp_gc_var_t *local_68;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_70 = &local_88;
  local_88 = (sexp)0x43e;
  local_40.var = &local_78;
  local_78 = (sexp)0x43e;
  local_50.var = &local_90;
  local_90 = (sexp)0x43e;
  local_60.var = &local_80;
  local_80 = (sexp)0x43e;
  local_40.next = (sexp_gc_var_t *)&local_70;
  local_68 = (ctx->value).context.saves;
  local_50.next = &local_40;
  local_60.next = &local_50;
  (ctx->value).context.saves = &local_60;
  psVar1 = (b->value).type.name;
  local_80 = sexp_mul(ctx,psVar1,psVar1);
  psVar1 = (b->value).type.cpl;
  local_88 = sexp_mul(ctx,psVar1,psVar1);
  local_80 = sexp_add(ctx,local_80,local_88);
  local_78 = sexp_mul(ctx,(a->value).type.name,(b->value).type.name);
  local_88 = sexp_mul(ctx,(a->value).type.cpl,(b->value).type.cpl);
  local_78 = sexp_add(ctx,local_78,local_88);
  local_78 = sexp_div(ctx,local_78,local_80);
  local_90 = sexp_mul(ctx,(a->value).type.cpl,(b->value).type.name);
  local_88 = sexp_mul(ctx,(a->value).type.name,(b->value).type.cpl);
  local_90 = sexp_sub(ctx,local_90,local_88);
  local_90 = sexp_div(ctx,local_90,local_80);
  local_88 = sexp_make_complex(ctx,local_78,local_90);
  (ctx->value).context.saves = local_68;
  psVar1 = sexp_complex_normalize(local_88);
  return psVar1;
}

Assistant:

sexp sexp_complex_div (sexp ctx, sexp a, sexp b) {
  sexp_gc_var4(res, real, imag, denom);
  sexp_gc_preserve4(ctx, res, real, imag, denom);
  /* c^2 + d^2 */
  denom = sexp_mul(ctx, sexp_complex_real(b), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(b), sexp_complex_imag(b));
  denom = sexp_add(ctx, denom, res);
  /* ac + bd */
  real = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_imag(b));
  real = sexp_add(ctx, real, res);
  real = sexp_div(ctx, real, denom);
  /* bc - ad */
  imag = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_imag(b));
  imag = sexp_sub(ctx, imag, res);
  imag = sexp_div(ctx, imag, denom);
  res = sexp_make_complex(ctx, real, imag);
  sexp_gc_release4(ctx);
  return sexp_complex_normalize(res);
}